

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanCommandBuffer.cpp
# Opt level: O3

void __thiscall
VulkanUtilities::VulkanCommandBuffer::TransitionImageLayout
          (VulkanCommandBuffer *this,VkImage Image,VkImageLayout OldLayout,VkImageLayout NewLayout,
          VkImageSubresourceRange *SubresRange,VkPipelineStageFlags SrcStages,
          VkPipelineStageFlags DstStages)

{
  uint Max0;
  uint Max1;
  VkPipelineStageFlags *pVVar1;
  VkAccessFlags *pVVar2;
  pointer *ppVVar3;
  uint Min1;
  int iVar4;
  uint Min0;
  uint Min1_00;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  VkAccessFlags VVar8;
  pointer pVVar9;
  uint Max1_00;
  undefined4 in_register_0000000c;
  char (*Args_1) [49];
  pointer pVVar10;
  long lVar11;
  undefined8 *puVar12;
  iterator __position;
  ulong uVar13;
  byte bVar14;
  string msg;
  undefined1 local_78 [20];
  uint uStack_64;
  VkImageLayout VStack_60;
  VkImageLayout VStack_5c;
  undefined8 local_58;
  VkImage pVStack_50;
  undefined1 local_48 [24];
  
  Args_1 = (char (*) [49])CONCAT44(in_register_0000000c,NewLayout);
  bVar14 = 0;
  if ((this->m_State).RenderPass == (VkRenderPass)0x0) {
    if ((this->m_State).DynamicRenderingHash != 0) {
      EndRendering(this);
    }
  }
  else {
    EndRenderPass(this);
  }
  uVar7 = (this->m_Barrier).SupportedStagesMask;
  if ((uVar7 & SrcStages) == 0) {
    Diligent::FormatString<char[26],char[49]>
              ((string *)local_78,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"(SrcStages & m_Barrier.SupportedStagesMask) != 0",Args_1);
    Diligent::DebugAssertionFailed
              ((Char *)local_78._0_8_,"TransitionImageLayout",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanCommandBuffer.cpp"
               ,0xa2);
    if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
      operator_delete((void *)local_78._0_8_,stack0xffffffffffffff98 + 1);
    }
    uVar7 = (this->m_Barrier).SupportedStagesMask;
  }
  if ((uVar7 & DstStages) == 0) {
    Diligent::FormatString<char[26],char[49]>
              ((string *)local_78,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"(DstStages & m_Barrier.SupportedStagesMask) != 0",
               (char (*) [49])(ulong)DstStages);
    Diligent::DebugAssertionFailed
              ((Char *)local_78._0_8_,"TransitionImageLayout",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanCommandBuffer.cpp"
               ,0xa3);
    if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
      operator_delete((void *)local_78._0_8_,stack0xffffffffffffff98 + 1);
    }
  }
  if (OldLayout == NewLayout) {
    (this->m_Barrier).MemorySrcStages = (this->m_Barrier).MemorySrcStages | SrcStages;
    pVVar1 = &(this->m_Barrier).MemoryDstStages;
    *pVVar1 = *pVVar1 | DstStages;
    VVar8 = anon_unknown_1::AccessMaskFromImageLayout(OldLayout,false);
    pVVar2 = &(this->m_Barrier).MemorySrcAccess;
    *pVVar2 = *pVVar2 | VVar8;
    VVar8 = anon_unknown_1::AccessMaskFromImageLayout(OldLayout,true);
    pVVar2 = &(this->m_Barrier).MemoryDstAccess;
    *pVVar2 = *pVVar2 | VVar8;
  }
  else {
    pVVar9 = (this->m_ImageBarriers).
             super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>._M_impl
             .super__Vector_impl_data._M_start;
    pVVar10 = (this->m_ImageBarriers).
              super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (pVVar10 != pVVar9) {
      lVar11 = 0x40;
      uVar13 = 0;
      do {
        if (*(VkImage *)((long)pVVar9 + lVar11 + -0x18) == Image) {
          uVar7 = SubresRange->layerCount + SubresRange->baseArrayLayer;
          if (SubresRange->layerCount == 0xffffffff) {
            uVar7 = 0xffffffff;
          }
          Min1 = *(uint *)((long)pVVar9 + lVar11 + -4);
          iVar4 = *(int *)((long)&pVVar9->sType + lVar11);
          Max1_00 = iVar4 + Min1;
          if (iVar4 == -1) {
            Max1_00 = 0xffffffff;
          }
          Min0 = SubresRange->baseMipLevel;
          Max0 = SubresRange->levelCount + Min0;
          if (SubresRange->levelCount == 0xffffffff) {
            Max0 = 0xffffffff;
          }
          Min1_00 = *(uint *)((long)pVVar9 + lVar11 + -0xc);
          iVar4 = *(int *)((long)pVVar9 + lVar11 + -8);
          Max1 = iVar4 + Min1_00;
          if (iVar4 == -1) {
            Max1 = 0xffffffff;
          }
          bVar5 = Diligent::CheckLineSectionOverlap<true,unsigned_int>
                            (SubresRange->baseArrayLayer,uVar7,Min1,Max1_00);
          bVar6 = Diligent::CheckLineSectionOverlap<true,unsigned_int>(Min0,Max0,Min1_00,Max1);
          if ((bVar5) && (bVar6)) {
            FlushBarriers(this);
            break;
          }
          pVVar9 = (this->m_ImageBarriers).
                   super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          pVVar10 = (this->m_ImageBarriers).
                    super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        }
        uVar13 = uVar13 + 1;
        lVar11 = lVar11 + 0x48;
      } while (uVar13 < (ulong)(((long)pVVar10 - (long)pVVar9 >> 3) * -0x71c71c71c71c71c7));
    }
    pVVar1 = &(this->m_Barrier).ImageSrcStages;
    *pVVar1 = *pVVar1 | SrcStages;
    pVVar1 = &(this->m_Barrier).ImageDstStages;
    *pVVar1 = *pVVar1 | DstStages;
    local_78._8_8_ = (void *)0x0;
    stack0xffffffffffffff98 = 0;
    local_58._0_4_ = 0;
    local_58._4_4_ = 0;
    local_78._0_8_ = (pointer)0x2d;
    VStack_5c = NewLayout;
    VStack_60 = OldLayout;
    local_48._0_4_ = SubresRange->aspectMask;
    local_48._4_4_ = SubresRange->baseMipLevel;
    local_48._8_4_ = SubresRange->levelCount;
    local_48._12_4_ = SubresRange->baseArrayLayer;
    local_48._20_4_ = 0;
    local_48._16_4_ = SubresRange->layerCount;
    pVStack_50 = Image;
    VVar8 = anon_unknown_1::AccessMaskFromImageLayout(OldLayout,false);
    local_78._16_4_ = VVar8 & (this->m_Barrier).SupportedAccessMask;
    VVar8 = anon_unknown_1::AccessMaskFromImageLayout(NewLayout,true);
    uStack_64 = VVar8 & (this->m_Barrier).SupportedAccessMask;
    local_58._0_4_ = 0xffffffff;
    local_58._4_4_ = 0xffffffff;
    __position._M_current =
         (this->m_ImageBarriers).
         super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->m_ImageBarriers).
        super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<VkImageMemoryBarrier,std::allocator<VkImageMemoryBarrier>>::
      _M_realloc_insert<VkImageMemoryBarrier&>
                ((vector<VkImageMemoryBarrier,std::allocator<VkImageMemoryBarrier>> *)
                 &this->m_ImageBarriers,__position,(VkImageMemoryBarrier *)local_78);
    }
    else {
      puVar12 = (undefined8 *)local_78;
      for (lVar11 = 9; lVar11 != 0; lVar11 = lVar11 + -1) {
        *(undefined8 *)__position._M_current = *puVar12;
        puVar12 = puVar12 + (ulong)bVar14 * -2 + 1;
        __position._M_current = __position._M_current + (ulong)bVar14 * -0x10 + 8;
      }
      ppVVar3 = &(this->m_ImageBarriers).
                 super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppVVar3 = *ppVVar3 + 1;
    }
  }
  return;
}

Assistant:

void VulkanCommandBuffer::TransitionImageLayout(VkImage                        Image,
                                                VkImageLayout                  OldLayout,
                                                VkImageLayout                  NewLayout,
                                                const VkImageSubresourceRange& SubresRange,
                                                VkPipelineStageFlags           SrcStages,
                                                VkPipelineStageFlags           DstStages)
{
    // Image layout transitions within a render pass execute
    // dependencies between attachments
    EndRenderScope();

    VERIFY_EXPR((SrcStages & m_Barrier.SupportedStagesMask) != 0);
    VERIFY_EXPR((DstStages & m_Barrier.SupportedStagesMask) != 0);

    if (OldLayout == NewLayout)
    {
        m_Barrier.MemorySrcStages |= SrcStages;
        m_Barrier.MemoryDstStages |= DstStages;

        m_Barrier.MemorySrcAccess |= AccessMaskFromImageLayout(OldLayout, false);
        m_Barrier.MemoryDstAccess |= AccessMaskFromImageLayout(NewLayout, true);
        return;
    }

    // Check overlapping subresources
    for (size_t i = 0; i < m_ImageBarriers.size(); ++i)
    {
        const auto& ImgBarrier = m_ImageBarriers[i];
        if (ImgBarrier.image != Image)
            continue;

        const auto& OtherRange = ImgBarrier.subresourceRange;

        const auto StartLayer0 = SubresRange.baseArrayLayer;
        const auto EndLayer0   = SubresRange.layerCount != VK_REMAINING_ARRAY_LAYERS ? (SubresRange.baseArrayLayer + SubresRange.layerCount) : ~0u;
        const auto StartLayer1 = OtherRange.baseArrayLayer;
        const auto EndLayer1   = OtherRange.layerCount != VK_REMAINING_ARRAY_LAYERS ? (OtherRange.baseArrayLayer + OtherRange.layerCount) : ~0u;

        const auto StartMip0 = SubresRange.baseMipLevel;
        const auto EndMip0   = SubresRange.levelCount != VK_REMAINING_MIP_LEVELS ? (SubresRange.baseMipLevel + SubresRange.levelCount) : ~0u;
        const auto StartMip1 = OtherRange.baseMipLevel;
        const auto EndMip1   = OtherRange.levelCount != VK_REMAINING_MIP_LEVELS ? (OtherRange.baseMipLevel + OtherRange.levelCount) : ~0u;

        const auto SlicesOverlap = Diligent::CheckLineSectionOverlap<true>(StartLayer0, EndLayer0, StartLayer1, EndLayer1);
        const auto MipsOverlap   = Diligent::CheckLineSectionOverlap<true>(StartMip0, EndMip0, StartMip1, EndMip1);

        // If the range overlaps with any of the existing barriers, we need to
        // flush them.
        if (SlicesOverlap && MipsOverlap)
        {
            FlushBarriers();
            break;
        }
    }

    m_Barrier.ImageSrcStages |= SrcStages;
    m_Barrier.ImageDstStages |= DstStages;

    VkImageMemoryBarrier ImgBarrier{};
    ImgBarrier.sType               = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
    ImgBarrier.pNext               = nullptr;
    ImgBarrier.oldLayout           = OldLayout;
    ImgBarrier.newLayout           = NewLayout;
    ImgBarrier.image               = Image;
    ImgBarrier.subresourceRange    = SubresRange;
    ImgBarrier.srcAccessMask       = AccessMaskFromImageLayout(OldLayout, false) & m_Barrier.SupportedAccessMask;
    ImgBarrier.dstAccessMask       = AccessMaskFromImageLayout(NewLayout, true) & m_Barrier.SupportedAccessMask;
    ImgBarrier.srcQueueFamilyIndex = VK_QUEUE_FAMILY_IGNORED; // source queue family for a queue family ownership transfer.
    ImgBarrier.dstQueueFamilyIndex = VK_QUEUE_FAMILY_IGNORED; // destination queue family for a queue family ownership transfer.
    m_ImageBarriers.emplace_back(ImgBarrier);
}